

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

void __thiscall QMainWindowLayout::addToolBarBreak(QMainWindowLayout *this,ToolBarArea area)

{
  uint uVar1;
  DockPosition DVar2;
  
  uVar1 = 3;
  if (area - LeftToolBarArea < 8) {
    uVar1 = *(int *)(&DAT_006e8c30 + (ulong)(area - LeftToolBarArea) * 4) - 1;
  }
  DVar2 = DockCount;
  if (uVar1 < 8) {
    DVar2 = *(DockPosition *)(&DAT_006e8c50 + (ulong)uVar1 * 4);
  }
  QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0xa0),DVar2);
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    DVar2 = DockCount;
    if (uVar1 < 8) {
      DVar2 = *(DockPosition *)(&DAT_006e8c50 + (ulong)uVar1 * 4);
    }
    QToolBarAreaLayout::addToolBarBreak((QToolBarAreaLayout *)(this + 0x3d8),DVar2);
  }
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

void QMainWindowLayout::addToolBarBreak(Qt::ToolBarArea area)
{
    area = validateToolBarArea(area);

    layoutState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));
    if (savedState.isValid())
        savedState.toolBarAreaLayout.addToolBarBreak(toDockPos(area));

    invalidate();
}